

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::formatter<fmt::v5::arg_join<int_*,_char>,_char,_void>::formatter
          (formatter<fmt::v5::arg_join<int_*,_char>,_char,_void> *this)

{
  formatter<int,_char,_void>::formatter((formatter<int,_char,_void> *)0x23b75e);
  return;
}

Assistant:

auto format(const arg_join<It, Char> &value, FormatContext &ctx)
      -> decltype(ctx.out()) {
    typedef formatter<typename std::iterator_traits<It>::value_type, Char> base;
    auto it = value.begin;
    auto out = ctx.out();
    if (it != value.end) {
      out = base::format(*it++, ctx);
      while (it != value.end) {
        out = std::copy(value.sep.begin(), value.sep.end(), out);
        ctx.advance_to(out);
        out = base::format(*it++, ctx);
      }
    }
    return out;
  }